

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constbuffer.c
# Opt level: O1

void CONSTBUFFER_DecRef_internal(CONSTBUFFER_HANDLE constbufferHandle)

{
  uint32_t *puVar1;
  CONSTBUFFER_TYPE CVar2;
  
  LOCK();
  puVar1 = &constbufferHandle->count;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    CVar2 = constbufferHandle->buffer_type;
    if (CVar2 == CONSTBUFFER_TYPE_FROM_OFFSET_AND_SIZE) {
      CONSTBUFFER_DecRef_internal(constbufferHandle->originalHandle);
    }
    else if (CVar2 == CONSTBUFFER_TYPE_WITH_CUSTOM_FREE) {
      (*constbufferHandle->custom_free_func)(constbufferHandle->custom_free_func_context);
    }
    else if (CVar2 == CONSTBUFFER_TYPE_MEMORY_MOVED) {
      free((constbufferHandle->alias).buffer);
    }
    free(constbufferHandle);
    return;
  }
  return;
}

Assistant:

static void CONSTBUFFER_DecRef_internal(CONSTBUFFER_HANDLE constbufferHandle)
{
    /*Codes_SRS_CONSTBUFFER_02_016: [Otherwise, CONSTBUFFER_DecRef shall decrement the refcount on the constbufferHandle handle.]*/
    if (DEC_REF_VAR(constbufferHandle->count) == DEC_RETURN_ZERO)
    {
        if (constbufferHandle->buffer_type == CONSTBUFFER_TYPE_MEMORY_MOVED)
        {
            free((void*)constbufferHandle->alias.buffer);
        }
        else if (constbufferHandle->buffer_type == CONSTBUFFER_TYPE_WITH_CUSTOM_FREE)
        {
            /* Codes_SRS_CONSTBUFFER_01_012: [ If the buffer was created by calling CONSTBUFFER_CreateWithCustomFree, the customFreeFunc function shall be called to free the memory, while passed customFreeFuncContext as argument. ]*/
            constbufferHandle->custom_free_func(constbufferHandle->custom_free_func_context);
        }
        /*Codes_SRS_CONSTBUFFER_02_024: [ If the constbufferHandle was created by calling CONSTBUFFER_CreateFromOffsetAndSize then CONSTBUFFER_DecRef shall decrement the ref count of the original handle passed to CONSTBUFFER_CreateFromOffsetAndSize. ]*/
        else if (constbufferHandle->buffer_type == CONSTBUFFER_TYPE_FROM_OFFSET_AND_SIZE)
        {
            CONSTBUFFER_DecRef_internal(constbufferHandle->originalHandle);
        }

        /*Codes_SRS_CONSTBUFFER_02_017: [If the refcount reaches zero, then CONSTBUFFER_DecRef shall deallocate all resources used by the CONSTBUFFER_HANDLE.]*/
        free(constbufferHandle);
    }
}